

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O1

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnRefNullExpr(BinaryReaderInterp *this,Type type)

{
  Result RVar1;
  Location loc;
  Location local_28;
  
  local_28.field_1.field_0.last_column = 0;
  local_28.filename._M_len = (this->filename_)._M_len;
  local_28.filename._M_str = (this->filename_)._M_str;
  local_28.field_1.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
       ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  RVar1 = SharedValidator::OnRefNull(&this->validator_,&local_28,type);
  if (RVar1.enum_ != Error) {
    Istream::Emit(this->istream_,RefNull);
  }
  return (Result)(uint)(RVar1.enum_ == Error);
}

Assistant:

Result BinaryReaderInterp::OnRefNullExpr(Type type) {
  CHECK_RESULT(validator_.OnRefNull(GetLocation(), type));
  istream_.Emit(Opcode::RefNull);
  return Result::Ok;
}